

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

int64_t gguf_find_tensor(gguf_context *ctx,char *name)

{
  int iVar1;
  ulong uVar2;
  char *__s2;
  ulong uVar3;
  
  uVar2 = (long)(ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (0 < (long)uVar2) {
    uVar2 = uVar2 / 0x158;
    uVar3 = 1;
    if (1 < uVar2) {
      uVar3 = uVar2;
    }
    uVar2 = 0;
    do {
      __s2 = gguf_get_tensor_name(ctx,uVar2);
      iVar1 = strcmp(name,__s2);
      if (iVar1 == 0) {
        return uVar2;
      }
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  return -1;
}

Assistant:

int64_t gguf_find_tensor(const struct gguf_context * ctx, const char * name) {
    // return -1 if tensor not found
    int64_t tensor_id = -1;

    const int64_t n_tensors = gguf_get_n_tensors(ctx);

    for (int64_t i = 0; i < n_tensors; ++i) {
        if (strcmp(name, gguf_get_tensor_name(ctx, i)) == 0) {
            tensor_id = i;
            break;
        }
    }

    return tensor_id;
}